

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS ref_part_by_extension(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  int *piVar1;
  REF_INT RVar2;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  bool bVar5;
  REF_FILEPOS RVar6;
  int iVar7;
  REF_STATUS RVar8;
  uint uVar9;
  size_t sVar10;
  REF_BYTE *pRVar11;
  FILE *__stream;
  size_t sVar12;
  __off_t _Var13;
  undefined8 uVar14;
  long lVar15;
  ulong uVar16;
  char *pcVar17;
  uint uVar18;
  REF_LONG ref_private_status_reis_ai;
  REF_GEOM pRVar19;
  REF_GRID_conflict pRVar20;
  char letter;
  int length;
  REF_BOOL available;
  REF_INT version;
  REF_INT dim_1;
  REF_INT dim;
  char units [3];
  int nqua2;
  int nqua;
  int ntri2;
  int ntri_int;
  int npyr;
  int npri;
  int nhex;
  int ntet_int;
  int boundary_patches;
  int cell_polynomial_order;
  int face_polynomial_order;
  int max_faces_per_cell;
  int max_nodes_per_cell;
  int max_nodes_per_face;
  int ncells;
  int nfaces;
  int nnodes;
  int refined;
  REF_INT keyword_code;
  int precision;
  int meshes;
  int revision;
  int magic;
  REF_FILEPOS next_position;
  char patch_type [17];
  char coordinate_system [7];
  REF_LONG ncell;
  double model_scale;
  REF_LONG nnode;
  REF_FILEPOS key_pos [156];
  char local_681;
  REF_GEOM local_680;
  REF_GRID_conflict local_678;
  REF_GRID_conflict local_670;
  uint local_664;
  REF_LONG local_660;
  double local_658;
  uint local_64c;
  double local_648;
  char local_63b [2];
  undefined1 local_639;
  double local_638;
  undefined8 uStack_630;
  double local_628;
  uint local_61c;
  int local_618;
  uint local_614;
  uint local_610;
  uint local_60c;
  uint local_608;
  uint local_604;
  uint local_600;
  int local_5fc;
  undefined4 local_5f8;
  uint local_5f4;
  uint local_5f0;
  uint local_5ec;
  uint local_5e8;
  uint local_5e4;
  uint local_5e0;
  uint local_5dc;
  uint local_5d8;
  uint local_5d4;
  REF_INT local_5d0;
  undefined1 local_5c9;
  uint local_5c8;
  uint local_5c4;
  uint local_5c0;
  uint local_5bc;
  REF_FILEPOS local_5b8 [4];
  undefined1 local_598;
  REF_LONG local_588 [2];
  undefined1 local_578;
  char local_56f [6];
  undefined1 local_569;
  REF_LONG local_568 [3];
  double local_550;
  REF_LONG local_548 [4];
  undefined1 local_528;
  REF_DBL local_518 [157];
  
  sVar10 = strlen(filename);
  if ((sVar10 < 0xb) || (iVar7 = strcmp(filename + (sVar10 - 10),".lb8.ugrid"), iVar7 != 0)) {
    if ((sVar10 < 10) || (iVar7 = strcmp(filename + (sVar10 - 9),".b8.ugrid"), iVar7 != 0)) {
      if ((sVar10 < 0xc) || (iVar7 = strcmp(filename + (sVar10 - 0xb),".lb8l.ugrid"), iVar7 != 0)) {
        if ((sVar10 < 0xb) || (iVar7 = strcmp(filename + (sVar10 - 10),".b8l.ugrid"), iVar7 != 0)) {
          if ((sVar10 < 0xd) ||
             (iVar7 = strcmp(filename + (sVar10 - 0xc),".lb8.ugrid64"), iVar7 != 0)) {
            if ((sVar10 < 0xc) ||
               (iVar7 = strcmp(filename + (sVar10 - 0xb),".b8.ugrid64"), iVar7 != 0)) {
              if ((sVar10 < 7) || (iVar7 = strcmp(filename + (sVar10 - 6),".meshb"), iVar7 != 0)) {
                if ((sVar10 < 5) || (iVar7 = strcmp(filename + (sVar10 - 4),".avm"), iVar7 != 0)) {
                  printf("%s: %d: %s %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0xd0c,"input file name extension unknown",filename);
                  pcVar17 = "unknown file extension";
                  uVar9 = 1;
                  uVar14 = 0xd0e;
                  uVar16 = 1;
                  goto LAB_001bce40;
                }
                uVar9 = ref_grid_create(ref_grid_ptr,ref_mpi);
                if (uVar9 == 0) {
                  pRVar20 = *ref_grid_ptr;
                  pRVar19 = (REF_GEOM)pRVar20->node;
                  if (ref_mpi->id == 0) {
                    local_670 = (REF_GRID_conflict)fopen(filename,"r");
                    if (local_670 == (REF_GRID_conflict)0x0) {
                      bVar5 = false;
                      printf("unable to open %s\n",filename);
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x60c,"ref_part_avm","unable to open file");
                      uVar9 = 2;
                    }
                    else {
                      local_664 = 6;
                      iVar7 = 6;
                      local_680 = pRVar19;
                      local_678 = pRVar20;
                      do {
                        sVar10 = fread(&local_681,1,1,(FILE *)local_670);
                        if (sVar10 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x60f,"ref_part_avm","letter",1,sVar10);
                          uVar9 = 1;
                          goto LAB_001bcacd;
                        }
                        putchar((int)local_681);
                        iVar7 = iVar7 + -1;
                      } while (iVar7 != 0);
                      putchar(10);
                      sVar10 = fread(&local_5bc,4,1,(FILE *)local_670);
                      pRVar20 = local_678;
                      if (sVar10 == 1) {
                        printf("%d magic\n",(ulong)local_5bc);
                        if ((long)(int)local_5bc != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x615,"ref_part_avm","magic",1,(long)(int)local_5bc);
                          uVar9 = 1;
                        }
                        pRVar19 = local_680;
                        if (local_5bc == 1) {
                          sVar10 = fread(&local_5c0,4,1,(FILE *)local_670);
                          if (sVar10 == 1) {
                            printf("%d revision\n",(ulong)local_5c0);
                            if ((long)(int)local_5c0 != 2) {
                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x618,"ref_part_avm","revision",2,(long)(int)local_5c0);
                              uVar9 = 1;
                            }
                            if (local_5c0 == 2) {
                              sVar10 = fread(&local_5c4,4,1,(FILE *)local_670);
                              if (sVar10 == 1) {
                                printf("%d meshes\n",(ulong)local_5c4);
                                if ((long)(int)local_5c4 != 1) {
                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0x61b,"ref_part_avm","meshes",1,(long)(int)local_5c4);
                                  uVar9 = 1;
                                }
                                if (local_5c4 == 1) {
                                  local_664 = 0x80;
                                  iVar7 = 0x80;
                                  do {
                                    sVar10 = fread(&local_681,1,1,(FILE *)local_670);
                                    if (sVar10 != 1) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x61e,"ref_part_avm","letter",1,sVar10);
                                      uVar9 = 1;
                                      goto LAB_001bcacd;
                                    }
                                    putchar((int)local_681);
                                    iVar7 = iVar7 + -1;
                                  } while (iVar7 != 0);
                                  putchar(10);
                                  sVar10 = fread(&local_5c8,4,1,(FILE *)local_670);
                                  if (sVar10 == 1) {
                                    printf("%d precision\n",(ulong)local_5c8);
                                    if ((long)(int)local_5c8 != 2) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x624,"ref_part_avm","precision",2,
                                             (long)(int)local_5c8);
                                      uVar9 = 1;
                                    }
                                    if (local_5c8 == 2) {
                                      sVar10 = fread(&local_64c,4,1,(FILE *)local_670);
                                      if (sVar10 == 1) {
                                        printf("%d dim\n",(ulong)local_64c);
                                        if ((local_64c & 0xfffffffe) != 2) {
                                          bVar5 = false;
                                          printf("%s: %d: %s: %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                 ,0x627,"ref_part_avm","dim");
                                          uVar9 = 1;
                                          pRVar19 = local_680;
                                          pRVar20 = local_678;
                                          goto LAB_001bcb69;
                                        }
                                        sVar10 = fread(&local_664,4,1,(FILE *)local_670);
                                        uVar18 = local_664;
                                        if (sVar10 == 1) {
                                          printf("%d description length\n",(ulong)local_664);
                                          if (0 < (int)uVar18) {
                                            do {
                                              sVar10 = fread(&local_681,1,1,(FILE *)local_670);
                                              if (sVar10 != 1) {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x62b,"ref_part_avm","letter",1,sVar10);
                                                uVar9 = 1;
                                                goto LAB_001bcacd;
                                              }
                                              putchar((int)local_681);
                                              uVar18 = uVar18 - 1;
                                            } while (uVar18 != 0);
                                          }
                                          putchar(10);
                                          local_664 = 0x80;
                                          iVar7 = 0x80;
                                          do {
                                            sVar10 = fread(&local_681,1,1,(FILE *)local_670);
                                            if (sVar10 != 1) {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x632,"ref_part_avm","letter",1,sVar10);
                                              uVar9 = 1;
                                              goto LAB_001bcacd;
                                            }
                                            putchar((int)local_681);
                                            iVar7 = iVar7 + -1;
                                          } while (iVar7 != 0);
                                          putchar(10);
                                          sVar10 = fread(&local_5d0,1,7,(FILE *)local_670);
                                          if (sVar10 == 7) {
                                            local_5c9 = 0;
                                            printf("%s",&local_5d0);
                                            iVar7 = strcmp("unstruc",(char *)&local_5d0);
                                            if (iVar7 == 0) {
                                              local_664 = 0x79;
                                              iVar7 = 0x79;
                                              do {
                                                sVar10 = fread(&local_681,1,1,(FILE *)local_670);
                                                if (sVar10 != 1) {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x63c,"ref_part_avm","letter",1,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                }
                                                putchar((int)local_681);
                                                iVar7 = iVar7 + -1;
                                              } while (iVar7 != 0);
                                              putchar(10);
                                              local_664 = 0x80;
                                              iVar7 = 0x80;
                                              do {
                                                sVar10 = fread(&local_681,1,1,(FILE *)local_670);
                                                if (sVar10 != 1) {
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x643,"ref_part_avm","letter",1,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                }
                                                putchar((int)local_681);
                                                iVar7 = iVar7 + -1;
                                              } while (iVar7 != 0);
                                              putchar(10);
                                              sVar10 = fread(local_56f,1,6,(FILE *)local_670);
                                              if (sVar10 == 6) {
                                                local_569 = 0;
                                                printf("%s",local_56f);
                                                uVar18 = ref_grid_parse_coordinate_system
                                                                   (local_678,local_56f);
                                                if (uVar18 == 0) {
                                                  local_664 = 0x7a;
                                                  iVar7 = 0x7a;
                                                  do {
                                                    sVar10 = fread(&local_681,1,1,(FILE *)local_670)
                                                    ;
                                                    if (sVar10 != 1) {
                                                      printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x64f,"ref_part_avm","letter",1,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                  }
                                                  putchar((int)local_681);
                                                  iVar7 = iVar7 + -1;
                                                  } while (iVar7 != 0);
                                                  putchar(10);
                                                  sVar10 = fread(&local_550,8,1,(FILE *)local_670);
                                                  if (sVar10 == 1) {
                                                    local_628 = local_550;
                                                    printf("%f model_scale\n");
                                                    local_638 = 1.0 - local_628;
                                                    if (local_638 <= -local_638) {
                                                      local_638 = -local_638;
                                                    }
                                                    uStack_630 = 0;
                                                    uVar18 = uVar9;
                                                    if (1e-12 < local_638) {
                                                      printf(
                                                  "%s: %d: %s: %s\nexpected %.15e, was %.15e, %e outside of %e\n"
                                                  ,0x3ff0000000000000,local_628,local_638,
                                                  0x3d719799812dea11,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x655,"ref_part_avm","model_scale");
                                                  uVar18 = 1;
                                                  }
                                                  uVar9 = uVar18;
                                                  if (local_638 <= 1e-12) {
                                                    sVar10 = fread(local_63b,1,2,(FILE *)local_670);
                                                    if (sVar10 == 2) {
                                                      local_639 = 0;
                                                      printf("%s",local_63b);
                                                      uVar9 = ref_grid_parse_unit(local_678,
                                                                                  local_63b);
                                                      if (uVar9 == 0) {
                                                        local_664 = 0x7e;
                                                        iVar7 = 0x7e;
                                                        do {
                                                          sVar10 = fread(&local_681,1,1,
                                                                         (FILE *)local_670);
                                                          if (sVar10 != 1) {
                                                            printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x65c,"ref_part_avm","letter",1,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                  }
                                                  putchar((int)local_681);
                                                  iVar7 = iVar7 + -1;
                                                  } while (iVar7 != 0);
                                                  putchar(10);
                                                  sVar10 = fread(local_518,8,7,(FILE *)local_670);
                                                  if (sVar10 == 7) {
                                                    uVar16 = 0;
                                                    do {
                                                      local_678->references[uVar16] =
                                                           local_518[uVar16];
                                                      printf("%f reference %d\n",uVar16 & 0xffffffff
                                                            );
                                                      uVar16 = uVar16 + 1;
                                                    } while (uVar16 != 7);
                                                    local_664 = 0x80;
                                                    iVar7 = 0x80;
                                                    do {
                                                      sVar10 = fread(&local_681,1,1,
                                                                     (FILE *)local_670);
                                                      if (sVar10 != 1) {
                                                        printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x668,"ref_part_avm","letter",1,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                  }
                                                  putchar((int)local_681);
                                                  iVar7 = iVar7 + -1;
                                                  } while (iVar7 != 0);
                                                  putchar(10);
                                                  sVar10 = fread(&local_5d4,4,1,(FILE *)local_670);
                                                  if (sVar10 == 1) {
                                                    printf("%d refined\n",(ulong)local_5d4);
                                                    uVar9 = uVar18;
                                                    if ((long)(int)local_5d4 != 0) {
                                                      printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x66e,"ref_part_avm","refined",0,
                                                  (long)(int)local_5d4);
                                                  uVar9 = 1;
                                                  }
                                                  if (local_5d4 == 0) {
                                                    local_664 = 0x80;
                                                    iVar7 = 0x80;
                                                    do {
                                                      sVar10 = fread(&local_681,1,1,
                                                                     (FILE *)local_670);
                                                      if (sVar10 != 1) {
                                                        printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x672,"ref_part_avm","letter",1,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                  }
                                                  putchar((int)local_681);
                                                  iVar7 = iVar7 + -1;
                                                  } while (iVar7 != 0);
                                                  putchar(10);
                                                  sVar10 = fread(&local_5d8,4,1,(FILE *)local_670);
                                                  if (sVar10 == 1) {
                                                    sVar10 = fread(&local_5dc,4,1,(FILE *)local_670)
                                                    ;
                                                    if (sVar10 == 1) {
                                                      sVar10 = fread(&local_5e0,4,1,
                                                                     (FILE *)local_670);
                                                      if (sVar10 == 1) {
                                                        printf("%d nnodes %d nfaces %d ncells\n",
                                                               (ulong)local_5d8,(ulong)local_5dc,
                                                               (ulong)local_5e0);
                                                        sVar10 = fread(&local_5e4,4,1,
                                                                       (FILE *)local_670);
                                                        if (sVar10 == 1) {
                                                          sVar10 = fread(&local_5e8,4,1,
                                                                         (FILE *)local_670);
                                                          if (sVar10 == 1) {
                                                            sVar10 = fread(&local_5ec,4,1,
                                                                           (FILE *)local_670);
                                                            if (sVar10 == 1) {
                                                              printf(
                                                  "%d max_nodes_per_face %d max_faces_per_face %d max_faces_per_cell\n"
                                                  ,(ulong)local_5e4,(ulong)local_5e8,
                                                  (ulong)local_5ec);
                                                  sVar10 = fread(local_5b8,1,0x20,(FILE *)local_670)
                                                  ;
                                                  if (sVar10 == 0x20) {
                                                    local_598 = 0;
                                                    puts((char *)local_5b8);
                                                    iVar7 = strcmp("uniform",(char *)local_5b8);
                                                    if (iVar7 == 0) {
                                                      sVar10 = fread(&local_5f0,4,1,
                                                                     (FILE *)local_670);
                                                      if (sVar10 == 1) {
                                                        sVar10 = fread(&local_5f4,4,1,
                                                                       (FILE *)local_670);
                                                        if (sVar10 == 1) {
                                                          printf(
                                                  "%d face_polynomial_order %d cell_polynomial_order\n"
                                                  ,(ulong)local_5f0,(ulong)local_5f4);
                                                  if ((long)(int)local_5f0 != 1) {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x692,"ref_part_avm","face_polynomial_order",1,
                                                  (long)(int)local_5f0);
                                                  uVar9 = 1;
                                                  }
                                                  if (local_5f0 == 1) {
                                                    if (local_5f4 == 1) {
                                                      sVar10 = fread(&local_5f8,4,1,
                                                                     (FILE *)local_670);
                                                      if (sVar10 == 1) {
                                                        local_628 = (double)CONCAT44(local_628._4_4_
                                                                                     ,local_5f8);
                                                        printf("%d boundary_patches\n");
                                                        sVar10 = fread(&local_600,4,1,
                                                                       (FILE *)local_670);
                                                        if (sVar10 == 1) {
                                                          sVar10 = fread(&local_5fc,4,1,
                                                                         (FILE *)local_670);
                                                          if (sVar10 == 1) {
                                                            local_648 = (double)(long)local_5fc;
                                                            local_638 = local_648;
                                                            sVar10 = fread(&local_604,4,1,
                                                                           (FILE *)local_670);
                                                            if (sVar10 == 1) {
                                                              sVar10 = fread(&local_608,4,1,
                                                                             (FILE *)local_670);
                                                              if (sVar10 == 1) {
                                                                printf(
                                                  "%d nhex %d ntet %d npri %d npyr\n",
                                                  (ulong)local_600,local_638,(ulong)local_604,
                                                  (ulong)local_608);
                                                  if ((long)(int)local_600 != 0) {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x69e,"ref_part_avm","cant do hex",0,
                                                  (long)(int)local_600);
                                                  uVar9 = 1;
                                                  }
                                                  if (local_600 == 0) {
                                                    if (local_604 == 0) {
                                                      if (local_608 == 0) {
                                                        if (local_5e0 != local_638._0_4_) {
                                                          printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6a1,"ref_part_avm","ncells does not match ntet"
                                                  ,(long)(int)local_5e0,local_638);
                                                  uVar9 = 1;
                                                  }
                                                  if (local_5e0 == local_638._0_4_) {
                                                    sVar10 = fread(&local_60c,4,1,(FILE *)local_670)
                                                    ;
                                                    if (sVar10 == 1) {
                                                      local_660 = (REF_LONG)(int)local_60c;
                                                      sVar10 = fread(&local_610,4,1,
                                                                     (FILE *)local_670);
                                                      if (sVar10 == 1) {
                                                        sVar10 = fread(&local_614,4,1,
                                                                       (FILE *)local_670);
                                                        if (sVar10 == 1) {
                                                          sVar10 = fread(&local_618,4,1,
                                                                         (FILE *)local_670);
                                                          if (sVar10 == 1) {
                                                            printf(
                                                  "%d ntri %d ntri %d nqua %d nqua\n",
                                                  (ulong)local_60c,(ulong)local_610,(ulong)local_614
                                                  );
                                                  if (local_660 == (int)local_610) {
                                                    if (local_614 == 0) {
                                                      if (local_618 == 0) {
                                                        sVar10 = fread(local_568,4,5,
                                                                       (FILE *)local_670);
                                                        if (sVar10 == 5) {
                                                          local_638 = (double)(long)(int)local_5d8;
                                                          lVar15 = 0;
                                                          do {
                                                            iVar7 = *(int *)((long)local_568 +
                                                                            lVar15 * 4);
                                                            if ((long)iVar7 != 0) {
                                                              printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6ae,"ref_part_avm","zeros not zero",0,
                                                  (long)iVar7);
                                                  uVar9 = 1;
                                                  }
                                                  if (iVar7 != 0) goto LAB_001bcacd;
                                                  lVar15 = lVar15 + 1;
                                                  } while (lVar15 != 5);
                                                  if (0 < local_628._0_4_) {
                                                    do {
                                                      sVar10 = fread(local_548,1,0x20,
                                                                     (FILE *)local_670);
                                                      if (sVar10 != 0x20) {
                                                        printf(
                                                  "%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6b1,"ref_part_avm","patch_label",0x20,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                  }
                                                  local_528 = 0;
                                                  sVar10 = fread(local_588,1,0x10,(FILE *)local_670)
                                                  ;
                                                  if (sVar10 != 0x10) {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6b3,"ref_part_avm","patch_type",0x10,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                  }
                                                  local_578 = 0;
                                                  sVar10 = fread(&local_61c,4,1,(FILE *)local_670);
                                                  if (sVar10 != 1) {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6b5,"ref_part_avm","patch_id",1,sVar10);
                                                  uVar9 = 1;
                                                  goto LAB_001bcacd;
                                                  }
                                                  printf("%s %s %d -> %d\n",local_548,local_588,
                                                         (ulong)local_61c,(ulong)-local_61c);
                                                  iVar7 = local_628._0_4_ + -1;
                                                  local_628 = (double)CONCAT44(local_628._4_4_,iVar7
                                                                              );
                                                  } while (iVar7 != 0);
                                                  }
                                                  local_658 = local_638;
                                                  bVar5 = true;
                                                  pRVar19 = local_680;
                                                  pRVar20 = local_678;
                                                  goto LAB_001bcb69;
                                                  }
                                                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6ac,"ref_part_avm","zeros",5,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6ab,"ref_part_avm","nquad mismatch",
                                                  (ulong)local_614,(long)local_618);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6aa,"ref_part_avm","cant do quad",0,
                                                  (long)(int)local_614);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6a9,"ref_part_avm","ntri mismatch",local_660,
                                                  (long)(int)local_610);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6a6,"ref_part_avm","nqua2",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6a5,"ref_part_avm","nqua",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6a4,"ref_part_avm","ntri2",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6a2,"ref_part_avm","ntri_int",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x6a0,"ref_part_avm","cant do pyramid",0,
                                                  (long)(int)local_608);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x69f,"ref_part_avm","cant do prism",0,
                                                  (long)(int)local_604);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x69b,"ref_part_avm","npyr",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x69a,"ref_part_avm","npri",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x698,"ref_part_avm","ntet_int",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x697,"ref_part_avm","nhex",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x695,"ref_part_avm","boundary_patches",1,sVar10)
                                                  ;
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x693,"ref_part_avm","cell_polynomial_order",1,
                                                  (long)(int)local_5f4);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x68e,"ref_part_avm","cell_polynomial_order",1,
                                                  sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x68b,"ref_part_avm","face_polynomial_order",1,
                                                  sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x688,"ref_part_avm","element_scheme",0,
                                                  (long)iVar7);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x685,"ref_part_avm","element_scheme",0x20,sVar10
                                                  );
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x680,"ref_part_avm","max_faces_per_cell",1,
                                                  sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x67e,"ref_part_avm","max_nodes_per_cell",1,
                                                  sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x67c,"ref_part_avm","max_nodes_per_face",1,
                                                  sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x678,"ref_part_avm","ncells",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x677,"ref_part_avm","nfaces",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x676,"ref_part_avm","nnodes",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x66c,"ref_part_avm","refined",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x660,"ref_part_avm","letter",7,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x659,"ref_part_avm",(ulong)uVar9,"parse unit");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x656,"ref_part_avm","units",2,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x653,"ref_part_avm","model_scale",1,sVar10);
                                                  uVar9 = 1;
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x64c,"ref_part_avm",(ulong)uVar18,
                                                  "parse coordinate_system");
                                                  uVar9 = uVar18;
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x648,"ref_part_avm","coordinate_system",6,sVar10
                                                  );
                                                uVar9 = 1;
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x639,"ref_part_avm","mesh type",0,(long)iVar7);
                                              uVar9 = 1;
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x636,"ref_part_avm","letter",7,sVar10);
                                            uVar9 = 1;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                 ,0x628,"ref_part_avm","length",1,sVar10);
                                          uVar9 = 1;
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x625,"ref_part_avm","dim",1,sVar10);
                                        uVar9 = 1;
                                      }
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x622,"ref_part_avm","precision",1,sVar10);
                                    uVar9 = 1;
                                  }
                                }
                              }
                              else {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0x619,"ref_part_avm","meshes",1,sVar10);
                                uVar9 = 1;
                              }
LAB_001bcacd:
                              bVar5 = false;
                              pRVar19 = local_680;
                              pRVar20 = local_678;
                              goto LAB_001bcb69;
                            }
                          }
                          else {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x616,"ref_part_avm","revision",1,sVar10);
                            uVar9 = 1;
                          }
                        }
                        bVar5 = false;
                      }
                      else {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x613,"ref_part_avm","magic",1,sVar10);
                        uVar9 = 1;
                        bVar5 = false;
                        pRVar19 = local_680;
                        pRVar20 = local_678;
                      }
                    }
LAB_001bcb69:
                    if (!bVar5) goto LAB_001bce18;
                  }
                  else {
                    local_670 = (REF_GRID_conflict)0x0;
                  }
                  uVar9 = ref_mpi_bcast(pRVar20->mpi,&local_64c,1,1);
                  if (uVar9 == 0) {
                    pRVar20->twod = (uint)(local_64c == 2);
                    uVar9 = ref_mpi_bcast(pRVar20->mpi,&pRVar20->coordinate_system,1,1);
                    if (uVar9 == 0) {
                      uVar9 = ref_mpi_bcast(pRVar20->mpi,&pRVar20->unit,1,1);
                      if (uVar9 == 0) {
                        uVar9 = ref_mpi_bcast(pRVar20->mpi,pRVar20->references,7,3);
                        if (uVar9 == 0) {
                          uVar9 = ref_mpi_bcast(pRVar20->mpi,&local_658,1,2);
                          if (uVar9 == 0) {
                            uVar9 = ref_mpi_bcast(pRVar20->mpi,&local_660,1,2);
                            if (uVar9 == 0) {
                              uVar9 = ref_mpi_bcast(pRVar20->mpi,&local_648,1,2);
                              if (uVar9 == 0) {
                                uVar9 = ref_part_node((FILE *)local_670,0,0,0,(REF_NODE)pRVar19,
                                                      (REF_LONG)local_658);
                                if (uVar9 == 0) {
                                  if (pRVar20->twod == 0) {
                                    pRVar3 = pRVar20->cell[3];
                                    uVar9 = ref_part_meshb_cell(pRVar3,local_660,(REF_NODE)pRVar19,
                                                                (REF_LONG)local_658,0,0,
                                                                (FILE *)local_670);
                                    if (uVar9 == 0) {
                                      if (0 < pRVar3->max) {
                                        pRVar4 = pRVar3->c2n;
                                        iVar7 = 0;
                                        do {
                                          lVar15 = (long)iVar7 * (long)pRVar3->size_per;
                                          if (pRVar4[lVar15] != -1) {
                                            piVar1 = pRVar4 + (long)(int)lVar15 +
                                                              (long)pRVar3->node_per;
                                            *piVar1 = -*piVar1;
                                          }
                                          iVar7 = iVar7 + 1;
                                        } while (iVar7 < pRVar3->max);
                                      }
                                      goto LAB_001bd27c;
                                    }
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x6e9);
                                  }
                                  else {
                                    pRVar3 = pRVar20->cell[0];
                                    uVar9 = ref_part_meshb_cell(pRVar3,local_660,(REF_NODE)pRVar19,
                                                                (REF_LONG)local_658,0,1,
                                                                (FILE *)local_670);
                                    if (uVar9 == 0) {
                                      if (0 < pRVar3->max) {
                                        pRVar4 = pRVar3->c2n;
                                        iVar7 = 0;
                                        do {
                                          lVar15 = (long)iVar7 * (long)pRVar3->size_per;
                                          if (pRVar4[lVar15] != -1) {
                                            piVar1 = pRVar4 + (long)(int)lVar15 +
                                                              (long)pRVar3->node_per;
                                            *piVar1 = -*piVar1;
                                          }
                                          iVar7 = iVar7 + 1;
                                        } while (iVar7 < pRVar3->max);
                                      }
LAB_001bd27c:
                                      if (pRVar20->twod == 0) {
                                        if (pRVar20->mpi->id == 0) {
                                          _Var13 = ftello((FILE *)local_670);
                                        }
                                        else {
                                          _Var13 = 0;
                                        }
                                        uVar9 = ref_part_bin_ugrid_cell
                                                          (pRVar20->cell[8],(REF_LONG)local_648,
                                                           (REF_NODE)pRVar19,(REF_GLOB)local_658,
                                                           (FILE *)local_670,_Var13,0,0,0);
                                        if (uVar9 == 0) goto LAB_001bd3f2;
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x709,"ref_part_avm",(ulong)uVar9,"read tet");
                                      }
                                      else {
                                        pRVar3 = pRVar20->cell[3];
                                        uVar9 = ref_part_meshb_cell(pRVar3,(REF_LONG)local_648,
                                                                    (REF_NODE)pRVar19,
                                                                    (REF_LONG)local_658,0,0,
                                                                    (FILE *)local_670);
                                        if (uVar9 == 0) {
                                          if (0 < pRVar3->max) {
                                            pRVar4 = pRVar3->c2n;
                                            iVar7 = 0;
                                            do {
                                              lVar15 = (long)pRVar3->size_per * (long)iVar7;
                                              if (pRVar4[lVar15] != -1) {
                                                RVar2 = pRVar4[lVar15 + 2];
                                                pRVar4[lVar15 + 2] = pRVar4[lVar15 + 1];
                                                pRVar4[(long)pRVar3->size_per * (long)iVar7 + 1] =
                                                     RVar2;
                                              }
                                              iVar7 = iVar7 + 1;
                                            } while (iVar7 < pRVar3->max);
                                          }
LAB_001bd3f2:
                                          if ((pRVar20->mpi->id == 0) &&
                                             (iVar7 = fclose((FILE *)local_670), iVar7 != 0)) {
                                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x70c,"ref_part_avm","close file",0,(long)iVar7);
                                            uVar9 = 1;
                                          }
                                          else {
                                            uVar9 = 0;
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                 ,0x6f8,"ref_part_avm",(ulong)uVar9,"read tri");
                                        }
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x6dc);
                                    }
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                         ,0x6d2,"ref_part_avm");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0x6cb,"ref_part_avm",(ulong)uVar9,"bcast");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x6ca,"ref_part_avm",(ulong)uVar9,"bcast");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x6c9,"ref_part_avm",(ulong)uVar9,"bcast");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x6c7,"ref_part_avm",(ulong)uVar9,"reference");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x6c4,"ref_part_avm",(ulong)uVar9,"unit");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x6c1,"ref_part_avm",(ulong)uVar9,"coordinate_system");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x6bc,"ref_part_avm",(ulong)uVar9,"dim");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x5ed,"ref_part_avm",(ulong)uVar9,"create grid");
                }
LAB_001bce18:
                if (uVar9 == 0) {
                  return 0;
                }
                pcVar17 = "avm failed";
                uVar14 = 0xd09;
              }
              else {
                local_5b8[0] = -1;
                if (ref_mpi->id == 0) {
                  uVar9 = ref_import_meshb_header
                                    (filename,(REF_INT *)&local_658,(REF_FILEPOS *)local_518);
                  if (uVar9 == 0) {
                    __stream = fopen(filename,"r");
                    if (__stream == (FILE *)0x0) {
                      printf("unable to open %s\n",filename);
                      pcVar17 = "unable to open file";
                      uVar14 = 0x2d2;
LAB_001bcb0b:
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,uVar14,"ref_part_meshb",pcVar17);
                      uVar9 = 2;
                    }
                    else {
                      uVar9 = ref_import_meshb_jump
                                        ((FILE *)__stream,local_658._0_4_,(REF_FILEPOS *)local_518,3
                                         ,(REF_BOOL *)&local_660,local_5b8);
                      if (uVar9 == 0) {
                        if ((int)local_660 == 0) {
                          pcVar17 = "meshb missing dimension";
                          uVar14 = 0x2d6;
LAB_001bcf4c:
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,uVar14,"ref_part_meshb",pcVar17);
                          uVar9 = 1;
                        }
                        else {
                          sVar10 = fread(&local_648,4,1,__stream);
                          if (sVar10 == 1) goto LAB_001bb7d7;
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x2d7,"ref_part_meshb","dim",1,sVar10);
                          uVar9 = 1;
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x2d5,"ref_part_meshb",(ulong)uVar9,"jump");
                      }
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x2cd,"ref_part_meshb",(ulong)uVar9,"header");
                  }
                }
                else {
                  __stream = (FILE *)0x0;
LAB_001bb7d7:
                  uVar9 = ref_mpi_bcast(ref_mpi,&local_658,1,1);
                  if (uVar9 == 0) {
                    uVar9 = ref_mpi_bcast(ref_mpi,&local_648,1,1);
                    if (uVar9 == 0) {
                      uVar9 = ref_grid_create(ref_grid_ptr,ref_mpi);
                      if (uVar9 == 0) {
                        local_670 = *ref_grid_ptr;
                        local_678 = (REF_GRID_conflict)local_670->node;
                        pRVar19 = local_670->geom;
                        local_670->twod = (uint)(local_648._0_4_ == 2);
                        if (local_670->mpi->id == 0) {
                          uVar9 = ref_import_meshb_jump
                                            ((FILE *)__stream,local_658._0_4_,
                                             (REF_FILEPOS *)local_518,4,(REF_BOOL *)&local_660,
                                             local_5b8);
                          if (uVar9 == 0) {
                            if ((int)local_660 == 0) {
                              pcVar17 = "meshb missing vertex";
                              uVar14 = 0x2e6;
                              goto LAB_001bcf4c;
                            }
                            local_680 = pRVar19;
                            RVar8 = ref_part_meshb_long((FILE *)__stream,local_658._0_4_,local_548);
                            pRVar19 = local_680;
                            if (RVar8 == 0) goto LAB_001bb904;
                            uVar9 = 1;
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x2e7,"ref_part_meshb",1,"nnode");
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x2e5,"ref_part_meshb",(ulong)uVar9,"jump");
                          }
                        }
                        else {
LAB_001bb904:
                          local_680 = pRVar19;
                          uVar9 = ref_mpi_bcast(ref_mpi,local_548,1,2);
                          if (uVar9 == 0) {
                            uVar9 = ref_part_node((FILE *)__stream,0,local_658._0_4_,local_670->twod
                                                  ,(REF_NODE)local_678,local_548[0]);
                            RVar6 = local_5b8[0];
                            if (uVar9 == 0) {
                              if ((local_670->mpi->id == 0) &&
                                 (_Var13 = ftello(__stream), RVar6 != _Var13)) {
                                printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0x2ef,"ref_part_meshb","vertex file location",RVar6,_Var13);
                                uVar9 = 1;
                              }
                              else {
                                lVar15 = 2;
                                do {
                                  pRVar3 = local_670->cell[lVar15 + -2];
                                  if (local_670->mpi->id == 0) {
                                    uVar9 = ref_cell_meshb_keyword(pRVar3,&local_5d0);
                                    if (uVar9 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x2f3,"ref_part_meshb",(ulong)uVar9,"kw");
                                      goto LAB_001bc23a;
                                    }
                                    uVar9 = ref_import_meshb_jump
                                                      ((FILE *)__stream,local_658._0_4_,
                                                       (REF_FILEPOS *)local_518,local_5d0,
                                                       (REF_BOOL *)&local_660,local_5b8);
                                    if (uVar9 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x2f6,"ref_part_meshb",(ulong)uVar9);
                                      goto LAB_001bc23a;
                                    }
                                    if ((int)local_660 != 0) {
                                      RVar8 = ref_part_meshb_long((FILE *)__stream,local_658._0_4_,
                                                                  local_568);
                                      if (RVar8 != 0) {
                                        uVar9 = 1;
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x2f8,"ref_part_meshb",1);
                                        goto LAB_001bc23a;
                                      }
                                    }
                                  }
                                  uVar9 = ref_mpi_bcast(ref_mpi,&local_660,1,1);
                                  if (uVar9 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x2fc,"ref_part_meshb",(ulong)uVar9);
                                    goto LAB_001bc23a;
                                  }
                                  if ((int)local_660 != 0) {
                                    uVar9 = ref_mpi_bcast(ref_mpi,local_568,1,2);
                                    if (uVar9 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x2fe,"ref_part_meshb",(ulong)uVar9);
                                      goto LAB_001bc23a;
                                    }
                                    uVar9 = ref_part_meshb_cell(pRVar3,local_568[0],
                                                                (REF_NODE)local_678,local_548[0],
                                                                local_658._0_4_,0,(FILE *)__stream);
                                    RVar6 = local_5b8[0];
                                    if (uVar9 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x301,"ref_part_meshb",(ulong)uVar9);
                                      goto LAB_001bc23a;
                                    }
                                    if ((local_670->mpi->id == 0) &&
                                       (_Var13 = ftello(__stream), RVar6 != _Var13)) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x303,"ref_part_meshb","cell file location",RVar6,
                                             _Var13);
                                      uVar9 = 1;
                                      goto LAB_001bc23a;
                                    }
                                  }
                                  lVar15 = lVar15 + 1;
                                } while (lVar15 != 0x12);
                                iVar7 = 0;
                                do {
                                  if (local_670->mpi->id == 0) {
                                    uVar9 = ref_import_meshb_jump
                                                      ((FILE *)__stream,local_658._0_4_,
                                                       (REF_FILEPOS *)local_518,iVar7 + 0x28,
                                                       (REF_BOOL *)&local_660,local_5b8);
                                    if (uVar9 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x30c,"ref_part_meshb",(ulong)uVar9,"jump");
                                      goto LAB_001bc23a;
                                    }
                                    if ((int)local_660 != 0) {
                                      RVar8 = ref_part_meshb_long((FILE *)__stream,local_658._0_4_,
                                                                  local_588);
                                      if (RVar8 != 0) {
                                        uVar9 = 1;
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x30e,"ref_part_meshb",1,"ngeom");
                                        goto LAB_001bc23a;
                                      }
                                    }
                                  }
                                  uVar9 = ref_mpi_bcast(ref_mpi,&local_660,1,1);
                                  if (uVar9 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x312,"ref_part_meshb",(ulong)uVar9,"bcast");
                                    goto LAB_001bc23a;
                                  }
                                  if ((int)local_660 != 0) {
                                    uVar9 = ref_mpi_bcast(ref_mpi,local_588,1,2);
                                    if (uVar9 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x314,"ref_part_meshb",(ulong)uVar9,"bcast");
                                      goto LAB_001bc23a;
                                    }
                                    uVar9 = ref_part_meshb_geom_bcast
                                                      (local_680,local_588[0],iVar7,
                                                       (REF_NODE)local_678,local_658._0_4_,
                                                       (FILE *)__stream);
                                    RVar6 = local_5b8[0];
                                    if (uVar9 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x317,"ref_part_meshb",(ulong)uVar9,"part geom");
                                      goto LAB_001bc23a;
                                    }
                                    if ((local_670->mpi->id == 0) &&
                                       (_Var13 = ftello(__stream), RVar6 != _Var13)) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x319,"ref_part_meshb","end location",RVar6,_Var13);
                                      uVar9 = 1;
                                      goto LAB_001bc23a;
                                    }
                                  }
                                  iVar7 = iVar7 + 1;
                                } while (iVar7 != 3);
                                if (local_670->mpi->id == 0) {
                                  uVar9 = ref_import_meshb_jump
                                                    ((FILE *)__stream,local_658._0_4_,
                                                     (REF_FILEPOS *)local_518,0x7e,
                                                     (REF_BOOL *)&local_660,local_5b8);
                                  if (uVar9 == 0) {
                                    if ((int)local_660 == 0) goto LAB_001bbf53;
                                    RVar8 = ref_part_meshb_size((FILE *)__stream,local_658._0_4_,
                                                                &local_680->cad_data_size);
                                    if (RVar8 == 0) {
                                      if (local_680->cad_data != (REF_BYTE *)0x0) {
                                        free(local_680->cad_data);
                                      }
                                      pRVar19 = local_680;
                                      sVar10 = local_680->cad_data_size;
                                      pRVar11 = (REF_BYTE *)malloc(sVar10);
                                      pRVar19->cad_data = pRVar11;
                                      if (pRVar11 == (REF_BYTE *)0x0) {
                                        pcVar17 = 
                                        "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
                                        uVar14 = 0x32b;
                                        goto LAB_001bcb0b;
                                      }
                                      sVar12 = fread(pRVar11,1,sVar10,__stream);
                                      RVar6 = local_5b8[0];
                                      if (sVar10 == sVar12) {
                                        _Var13 = ftello(__stream);
                                        if (RVar6 == _Var13) goto LAB_001bbf53;
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x330,"ref_part_meshb","end location",RVar6,_Var13);
                                        uVar9 = 1;
                                      }
                                      else {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x32f,"ref_part_meshb","cad_data",sVar10,sVar12);
                                        uVar9 = 1;
                                      }
                                    }
                                    else {
                                      uVar9 = 1;
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x325,"ref_part_meshb",1,"cad data size");
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x321,"ref_part_meshb",(ulong)uVar9,"jump");
                                  }
                                }
                                else {
LAB_001bbf53:
                                  uVar9 = ref_mpi_bcast(ref_mpi,&local_660,1,1);
                                  if (uVar9 == 0) {
                                    if ((int)local_660 == 0) {
LAB_001bc0b1:
                                      uVar9 = ref_geom_ghost(local_680,(REF_NODE)local_678);
                                      if (uVar9 == 0) {
                                        uVar9 = ref_node_ghost_real((REF_NODE)local_678);
                                        if (uVar9 == 0) {
                                          uVar9 = ref_grid_inward_boundary_orientation(local_670);
                                          if (uVar9 == 0) {
                                            uVar9 = 0;
                                            if (local_670->mpi->id == 0) {
                                              fclose(__stream);
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                  ,0x347,"ref_part_meshb",(ulong)uVar9,
                                                  "inward boundary orientation");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                                 ,0x344,"ref_part_meshb",(ulong)uVar9,"ghost real");
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x343,"ref_part_meshb",(ulong)uVar9,
                                               "fill geom ghosts");
                                      }
                                    }
                                    else {
                                      uVar9 = ref_mpi_bcast(ref_mpi,&local_680->cad_data_size,1,2);
                                      if (uVar9 == 0) {
                                        if (local_670->mpi->id != 0) {
                                          if (local_680->cad_data != (REF_BYTE *)0x0) {
                                            free(local_680->cad_data);
                                          }
                                          pRVar19 = local_680;
                                          pRVar11 = (REF_BYTE *)malloc(local_680->cad_data_size);
                                          pRVar19->cad_data = pRVar11;
                                          if (pRVar11 == (REF_BYTE *)0x0) {
                                            pcVar17 = 
                                            "malloc ref_geom_cad_data(ref_geom) of REF_BYTE NULL";
                                            uVar14 = 0x33c;
                                            goto LAB_001bcb0b;
                                          }
                                        }
                                        uVar9 = ref_mpi_bcast(ref_mpi,local_680->cad_data,
                                                              (REF_INT)local_680->cad_data_size,4);
                                        if (uVar9 == 0) goto LAB_001bc0b1;
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x340,"ref_part_meshb",(ulong)uVar9,"bcast");
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0x337,"ref_part_meshb",(ulong)uVar9,"bcast");
                                      }
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0x333,"ref_part_meshb",(ulong)uVar9,"bcast");
                                  }
                                }
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                     ,0x2ed,"ref_part_meshb",(ulong)uVar9);
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x2ea,"ref_part_meshb",(ulong)uVar9,"bcast");
                          }
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x2dc,"ref_part_meshb",(ulong)uVar9,"create grid");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x2db,"ref_part_meshb",(ulong)uVar9,"bcast");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x2da,"ref_part_meshb",(ulong)uVar9,"bcast");
                  }
                }
LAB_001bc23a:
                if (uVar9 == 0) {
                  return 0;
                }
                pcVar17 = "meshb failed";
                uVar14 = 0xd05;
              }
            }
            else {
              uVar9 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
              if (uVar9 == 0) {
                return 0;
              }
              pcVar17 = "b8_ugrid failed";
              uVar14 = 0xd00;
            }
          }
          else {
            uVar9 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
            if (uVar9 == 0) {
              return 0;
            }
            pcVar17 = "lb8_ugrid failed";
            uVar14 = 0xcfa;
          }
        }
        else {
          uVar9 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,1);
          if (uVar9 == 0) {
            return 0;
          }
          pcVar17 = "b8_ugrid failed";
          uVar14 = 0xcf3;
        }
      }
      else {
        uVar9 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,1);
        if (uVar9 == 0) {
          return 0;
        }
        pcVar17 = "lb8_ugrid failed";
        uVar14 = 0xced;
      }
    }
    else {
      uVar9 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,1,0);
      if (uVar9 == 0) {
        return 0;
      }
      pcVar17 = "b8_ugrid failed";
      uVar14 = 0xce6;
    }
  }
  else {
    uVar9 = ref_part_bin_ugrid(ref_grid_ptr,ref_mpi,filename,0,0);
    if (uVar9 == 0) {
      return 0;
    }
    pcVar17 = "lb8_ugrid failed";
    uVar14 = 0xcdf;
  }
  uVar16 = (ulong)uVar9;
LAB_001bce40:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar14,
         "ref_part_by_extension",uVar16,pcVar17);
  return uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_part_by_extension(REF_GRID *ref_grid_ptr,
                                         REF_MPI ref_mpi,
                                         const char *filename) {
  size_t end_of_string;

  end_of_string = strlen(filename);

  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".lb8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_FALSE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 9 &&
      strcmp(&filename[end_of_string - 9], ".b8.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE,
                           REF_FALSE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".lb8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 10 &&
      strcmp(&filename[end_of_string - 10], ".b8l.ugrid") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 12 &&
      strcmp(&filename[end_of_string - 12], ".lb8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_FALSE,
                           REF_TRUE),
        "lb8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 11 &&
      strcmp(&filename[end_of_string - 11], ".b8.ugrid64") == 0) {
    RSS(ref_part_bin_ugrid(ref_grid_ptr, ref_mpi, filename, REF_TRUE, REF_TRUE),
        "b8_ugrid failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 6 &&
      strcmp(&filename[end_of_string - 6], ".meshb") == 0) {
    RSS(ref_part_meshb(ref_grid_ptr, ref_mpi, filename), "meshb failed");
    return REF_SUCCESS;
  }
  if (end_of_string > 4 && strcmp(&filename[end_of_string - 4], ".avm") == 0) {
    RSS(ref_part_avm(ref_grid_ptr, ref_mpi, filename), "avm failed");
    return REF_SUCCESS;
  }
  printf("%s: %d: %s %s\n", __FILE__, __LINE__,
         "input file name extension unknown", filename);
  RSS(REF_FAILURE, "unknown file extension");
  return REF_FAILURE;
}